

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter
helicsCoreRegisterFilter(HelicsCore core,HelicsFilterTypes type,char *name,HelicsError *err)

{
  Filter *pFVar1;
  _Head_base<0UL,_helics::Filter_*,_false> _Var2;
  HelicsFilter pvVar3;
  string_view name_00;
  __single_object filt;
  shared_ptr<helics::Core> corePtr;
  allocator<char> local_71;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_70;
  _Head_base<0UL,_helics::Filter_*,_false> local_68;
  __uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_60;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48 [8];
  char *local_40;
  
  getCoreSharedPtr(&local_58,(HelicsError *)core);
  if (local_58._M_ptr == (element_type *)0x0) {
    pvVar3 = (HelicsFilter)0x0;
  }
  else {
    std::make_unique<helics::FilterObject>();
    if (name == (char *)0x0) {
      std::__cxx11::string::string(local_48,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_48,name,&local_71);
    }
    name_00._M_str = local_40;
    name_00._M_len = (size_t)local_58._M_ptr;
    helics::make_filter((FilterTypes)&local_68,(Core *)(ulong)type,name_00);
    _Var2._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (Filter *)0x0;
    pFVar1 = ((local_70._M_head_impl)->uFilter)._M_t.
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    ((local_70._M_head_impl)->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pFVar1 != (Filter *)0x0) {
      (**(code **)((long)(pFVar1->super_Interface)._vptr_Interface + 8))();
      if (local_68._M_head_impl != (Filter *)0x0) {
        (*((local_68._M_head_impl)->super_Interface)._vptr_Interface[1])();
      }
    }
    local_68._M_head_impl = (Filter *)0x0;
    std::__cxx11::string::~string(local_48);
    (local_70._M_head_impl)->filtPtr =
         ((local_70._M_head_impl)->uFilter)._M_t.
         super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_70._M_head_impl)->corePtr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,&local_58);
    (local_70._M_head_impl)->custom = type == HELICS_FILTER_TYPE_CUSTOM;
    local_60._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (tuple<helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>)
         (tuple<helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>)
         local_70._M_head_impl;
    local_70._M_head_impl = (FilterObject *)0x0;
    pvVar3 = anon_unknown.dwarf_a089a::coreAddFilter
                       (core,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                              *)&local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               &local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               &local_70);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return pvVar3;
}

Assistant:

HelicsFilter helicsCoreRegisterFilter(HelicsCore core, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_filter(static_cast<helics::FilterTypes>(type), corePtr.get(), AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}